

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void __thiscall ObjectBlockPool<8,_8192>::Reset(ObjectBlockPool<8,_8192> *this)

{
  LargeBlock<8,_8192> *pLVar1;
  MyLargeBlock *following;
  ObjectBlockPool<8,_8192> *this_local;
  
  if (this->activePages != (MyLargeBlock *)0x0) {
    do {
      pLVar1 = this->activePages->next;
      NULLC::alignedDealloc(this->activePages);
      this->activePages = pLVar1;
    } while (this->activePages != (MyLargeBlock *)0x0);
    this->freeBlocks = &this->lastBlock;
    this->activePages = (MyLargeBlock *)0x0;
    this->lastNum = 0x2000;
    FastVector<LargeBlock<8,_8192>_*,_false,_false>::reset(&this->sortedPages);
    FastVector<SmallBlock<8>_*,_false,_false>::reset(&this->objectsToFinalize);
    FastVector<SmallBlock<8>_*,_false,_false>::reset(&this->objectsToFree);
  }
  return;
}

Assistant:

void Reset()
	{
		if(!activePages)
			return;
		do
		{
			MyLargeBlock* following = activePages->next;
			NULLC::alignedDealloc(activePages);
			activePages = following;
		}while(activePages != NULL);

		freeBlocks = &lastBlock;
		activePages = NULL;
		lastNum = countInBlock;

		sortedPages.reset();
		objectsToFinalize.reset();
		objectsToFree.reset();
	}